

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

CAddr __thiscall cppforth::Forth::setVirtualMemory(Forth *this,string *value,int segmentName)

{
  pointer pVVar1;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar local_39;
  ulong local_38;
  
  uVar4 = (ulong)segmentName;
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->VirtualMemory).
                            super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5)) {
    this_00 = &pVVar1[uVar4].segment;
    local_38 = uVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0);
    if (0 < (long)value->_M_string_length) {
      puVar2 = (uchar *)(value->_M_dataplus)._M_p;
      lVar3 = value->_M_string_length + 1;
      do {
        local_39 = *puVar2;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (this_00,&local_39);
        puVar2 = puVar2 + 1;
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
    pVVar1 = (this->VirtualMemory).
             super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_38 <
        (ulong)((long)(this->VirtualMemory).
                      super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 5)) {
      pVVar1[uVar4].end =
           (*(int *)((long)&pVVar1[uVar4].segment.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl + 8) -
           *(int *)&pVVar1[uVar4].segment.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl) +
           pVVar1[uVar4].start;
      return pVVar1[uVar4].start;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

CAddr setVirtualMemory(const std::string &value, int segmentName){
			auto &sourceBufferVirtual = VirtualMemory.at(segmentName).segment;
			sourceBufferVirtual.resize(0);
			std::copy(value.begin(), value.end(), std::back_inserter(sourceBufferVirtual));
			VirtualMemory.at(segmentName).end = VirtualMemory.at(segmentName).start + 
				static_cast<Cell>(VirtualMemory.at(segmentName).segment.size());
			return VirtualMemory.at(segmentName).start ;
		}